

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O1

void __thiscall ELLIPSOID::ELLIPSOID(ELLIPSOID *this)

{
  this->a = 6378137.0;
  this->b = 6356752.3142;
  this->c = 6399593.625803977;
  this->alpha = 0.0033528106718309896;
  this->e2 = 0.006694380004260827;
  this->e1_2 = 0.006739496756586903;
  return;
}

Assistant:

ELLIPSOID::ELLIPSOID()
{
    this->a = a_w;
    this->b = b_w;
    this->c = this->a * this->a / this->b;
    this->alpha = (this->a - this->b) / this->a;
    this->e2 = (this->a * this->a - this->b * this->b) / (this->a * this->a);
    this->e1_2 = (this->a * this->a - this->b * this->b) / (this->b * this->b);
}